

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tok_read_defines(tokcxdef *ctx,osfildef *fp,errcxdef *ec)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  size_t sVar4;
  tokdfdef *__ptr;
  tokdfdef *ptVar5;
  ulong uVar6;
  bool bVar7;
  char buf [4];
  tokdfdef **local_38;
  
  local_38 = ctx->tokcxdf;
  iVar3 = 0x40;
  do {
    bVar7 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar7) {
      return;
    }
LAB_00114f02:
    sVar4 = fread(buf,4,1,(FILE *)fp);
    uVar2 = buf._2_2_;
    uVar1 = buf._0_2_;
    if (sVar4 != 1) {
LAB_00114fee:
      errsigf(ec,"TADS",0x25f);
    }
    if (buf._0_2_ != 0) {
      uVar6 = (ulong)(ushort)buf._2_2_;
      __ptr = (tokdfdef *)
              mchalo(ec,(ulong)((uint)(ushort)buf._2_2_ + (uint)(ushort)buf._0_2_) + 0x1f,
                     "tok_read_defines");
      __ptr->explen = (uint)(ushort)uVar2;
      __ptr->nm = __ptr->expan + uVar6;
      __ptr->len = (uint)(ushort)uVar1;
      sVar4 = fread(__ptr->expan + uVar6,(ulong)(uint)(ushort)uVar1,1,(FILE *)fp);
      if ((sVar4 != 1) ||
         (((long)__ptr->explen != 0 &&
          (sVar4 = fread(__ptr->expan,(long)__ptr->explen,1,(FILE *)fp), sVar4 != 1))))
      goto LAB_00114fee;
      ptVar5 = tok_find_define(ctx,__ptr->nm,__ptr->len);
      if (ptVar5 == (tokdfdef *)0x0) {
        __ptr->nxt = *local_38;
        *local_38 = __ptr;
      }
      else {
        free(__ptr);
      }
      goto LAB_00114f02;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void tok_read_defines(tokcxdef *ctx, osfildef *fp, errcxdef *ec)
{
    int        i;
    tokdfdef **dfp;
    tokdfdef  *df;
    char       buf[4];

    /* write each element of the hash chains */
    for (i = TOKDFHSHSIZ, dfp = ctx->tokcxdf ; i ; ++dfp, --i)
    {
        /* read this hash chain */
        for (;;)
        {
            /* read the next entry's header, and stop if this is the end */
            if (osfrb(fp, buf, 4)) errsig(ec, ERR_RDGAM);
            if (osrp2(buf) == 0) break;

            /* set up a new symbol of the appropriate size */
            df = (tokdfdef *)mchalo(ec,
                                    (sizeof(tokdfdef) + osrp2(buf)
                                     + osrp2(buf+2) - 1),
                                    "tok_read_defines");
            df->explen = osrp2(buf+2);
            df->nm = df->expan + df->explen;
            df->len = osrp2(buf);

            /* read the rest of the symbol */
            if (osfrb(fp, df->nm, df->len)
                || (df->explen != 0 && osfrb(fp, df->expan, df->explen)))
                errsig(ec, ERR_RDGAM);

            /*
             *   If a symbol with this name already exists in the table,
             *   discard the new one -- the symbols defined by -D and the
             *   current set of built-in symbols takes precedence over the
             *   set loaded from the file.  
             */
            if (tok_find_define(ctx, df->nm, df->len))
            {
                /* simply discard this symbol */
                mchfre(df);
            }
            else
            {
                /* link it into this hash chain */
                df->nxt = *dfp;
                *dfp = df;
            }
        }
    }
}